

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O2

REF_STATUS ref_face_with(REF_FACE ref_face,REF_INT *nodes,REF_INT *face)

{
  int iVar1;
  REF_ADJ pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  REF_INT RVar9;
  REF_INT candidate [4];
  REF_INT target [4];
  REF_INT orig [4];
  
  *face = -1;
  uVar5 = ref_face_make_canonical(nodes,target);
  if (uVar5 == 0) {
    iVar1 = *nodes;
    uVar8 = 0xffffffff;
    RVar9 = -1;
    if (-1 < (long)iVar1) {
      pRVar2 = ref_face->adj;
      uVar8 = 0xffffffff;
      RVar9 = -1;
      if (iVar1 < pRVar2->nnode) {
        uVar5 = pRVar2->first[iVar1];
        uVar8 = 0xffffffff;
        RVar9 = -1;
        if ((long)(int)uVar5 != -1) {
          RVar9 = pRVar2->item[(int)uVar5].ref;
          uVar8 = (ulong)uVar5;
        }
      }
    }
    uVar5 = 5;
    while ((int)uVar8 != -1) {
      pRVar3 = ref_face->f2n;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        orig[lVar7] = pRVar3[RVar9 * 4 + lVar7];
      }
      uVar6 = ref_face_make_canonical(orig,candidate);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x8e
               ,"ref_face_with",(ulong)uVar6,"canonical");
        return uVar6;
      }
      if ((((target[0] == candidate[0]) && (target[1] == candidate[1])) &&
          (target[2] == candidate[2])) && (target[3] == candidate[3])) {
        *face = RVar9;
        return 0;
      }
      pRVar4 = ref_face->adj->item;
      uVar8 = (ulong)pRVar4[(int)uVar8].next;
      RVar9 = -1;
      if (uVar8 != 0xffffffffffffffff) {
        RVar9 = pRVar4[uVar8].ref;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x89,
           "ref_face_with",(ulong)uVar5,"canonical");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_face_with(REF_FACE ref_face, REF_INT *nodes,
                                 REF_INT *face) {
  REF_INT item, ref, node;
  REF_INT target[4], candidate[4], orig[4];

  (*face) = REF_EMPTY;

  RSS(ref_face_make_canonical(nodes, target), "canonical");

  each_ref_adj_node_item_with_ref(ref_face_adj(ref_face), nodes[0], item, ref) {
    for (node = 0; node < 4; node++)
      orig[node] = ref_face_f2n(ref_face, node, ref);
    RSS(ref_face_make_canonical(orig, candidate), "canonical");
    if (target[0] == candidate[0] && target[1] == candidate[1] &&
        target[2] == candidate[2] && target[3] == candidate[3]) {
      (*face) = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}